

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tick_log10.c
# Opt level: O2

double mpt_tick_log10(int val)

{
  if (val - 10U < 0xfffffff8) {
    return NAN;
  }
  return mpt_tick_log10::logs[(uint)val];
}

Assistant:

extern double mpt_tick_log10(int val)
{
	static const double logs[8] = {
		0.3010299956639812,
		0.47712125471966244,
		0.6020599913279624,
		0.69897000433601886,
		0.77815125038364363,
		0.84509804001425681,
		0.90308998699194354,
		0.95424250943932487
	};
	if (val < 2 || val > 9) {
		return NAN;
	}
	return logs[val];
}